

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpNamespace(xmlDebugCtxtPtr ctxt,xmlNsPtr ns)

{
  xmlNsPtr ns_local;
  xmlDebugCtxtPtr ctxt_local;
  
  xmlCtxtDumpSpaces(ctxt);
  if (ns == (xmlNsPtr)0x0) {
    if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"namespace node is NULL\n");
    }
  }
  else if (ns->type == XML_NAMESPACE_DECL) {
    if (ns->href == (xmlChar *)0x0) {
      if (ns->prefix == (xmlChar *)0x0) {
        xmlDebugErr(ctxt,0x13a4,"Incomplete default namespace href=NULL\n");
      }
      else {
        xmlDebugErr3(ctxt,0x13a4,"Incomplete namespace %s href=NULL\n",(char *)ns->prefix);
      }
    }
    else if (ctxt->check == 0) {
      if (ns->prefix == (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,"default namespace href=");
      }
      else {
        fprintf((FILE *)ctxt->output,"namespace %s href=",ns->prefix);
      }
      xmlCtxtDumpString(ctxt,ns->href);
      fprintf((FILE *)ctxt->output,"\n");
    }
  }
  else {
    xmlDebugErr(ctxt,0x13a3,"Node is not a namespace declaration");
  }
  return;
}

Assistant:

static void
xmlCtxtDumpNamespace(xmlDebugCtxtPtr ctxt, xmlNsPtr ns)
{
    xmlCtxtDumpSpaces(ctxt);

    if (ns == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "namespace node is NULL\n");
        return;
    }
    if (ns->type != XML_NAMESPACE_DECL) {
	xmlDebugErr(ctxt, XML_CHECK_NOT_NS_DECL,
	            "Node is not a namespace declaration");
        return;
    }
    if (ns->href == NULL) {
        if (ns->prefix != NULL)
	    xmlDebugErr3(ctxt, XML_CHECK_NO_HREF,
                    "Incomplete namespace %s href=NULL\n",
                    (char *) ns->prefix);
        else
	    xmlDebugErr(ctxt, XML_CHECK_NO_HREF,
                    "Incomplete default namespace href=NULL\n");
    } else {
        if (!ctxt->check) {
            if (ns->prefix != NULL)
                fprintf(ctxt->output, "namespace %s href=",
                        (char *) ns->prefix);
            else
                fprintf(ctxt->output, "default namespace href=");

            xmlCtxtDumpString(ctxt, ns->href);
            fprintf(ctxt->output, "\n");
        }
    }
}